

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# qmdisubwindow.cpp
# Opt level: O0

void __thiscall QMdiSubWindow::QMdiSubWindow(QMdiSubWindow *this,QWidget *parent,WindowFlags flags)

{
  byte bVar1;
  QWidgetPrivate *dd;
  QMdiSubWindowPrivate *this_00;
  QMdiSubWindowPrivate *this_01;
  QStyle *pQVar2;
  QCoreApplication *pQVar3;
  undefined4 in_EDX;
  QWidget *in_RSI;
  char *in_RDI;
  long in_FS_OFFSET;
  QMdiSubWindowPrivate *in_stack_00000010;
  QMdiSubWindowPrivate *d;
  undefined4 in_stack_ffffffffffffff28;
  FocusPolicy in_stack_ffffffffffffff2c;
  QWidget *in_stack_ffffffffffffff30;
  QObject *this_02;
  QMdiSubWindowPrivate *in_stack_ffffffffffffff40;
  undefined8 in_stack_ffffffffffffff48;
  QFlagsStorage<Qt::WindowType> f;
  undefined7 in_stack_ffffffffffffff60;
  undefined1 in_stack_ffffffffffffff67;
  QObject local_80 [8];
  QIcon local_78;
  undefined1 local_70 [3];
  undefined1 in_stack_ffffffffffffff93;
  WidgetAttribute in_stack_ffffffffffffff94;
  QIcon in_stack_ffffffffffffff98;
  undefined1 local_30 [4];
  undefined4 local_2c;
  QFont local_28 [16];
  QPalette local_18;
  long local_8;
  
  f.i = (Int)((ulong)in_stack_ffffffffffffff48 >> 0x20);
  local_8 = *(long *)(in_FS_OFFSET + 0x28);
  local_2c = in_EDX;
  dd = (QWidgetPrivate *)operator_new(0x470);
  QMdiSubWindowPrivate::QMdiSubWindowPrivate(in_stack_ffffffffffffff40);
  memset(local_30,0,4);
  QFlags<Qt::WindowType>::QFlags((QFlags<Qt::WindowType> *)0x632d29);
  QWidget::QWidget(in_RSI,dd,in_stack_ffffffffffffff30,(WindowFlags)f.i);
  *(undefined ***)in_RDI = &PTR_metaObject_00d17358;
  *(undefined ***)(in_RDI + 0x10) = &PTR__QMdiSubWindow_00d17508;
  this_00 = d_func((QMdiSubWindow *)0x632d6d);
  QMdiSubWindowPrivate::createSystemMenu(in_stack_00000010);
  QPointer<QMenu>::operator->((QPointer<QMenu> *)0x632d8d);
  QWidget::actions((QWidget *)dd);
  QWidget::addActions(in_RSI,(QList<QAction_*> *)dd);
  QList<QAction_*>::~QList((QList<QAction_*> *)0x632dbc);
  (**(code **)(*(long *)&this_00->super_QWidgetPrivate + 0x28))(this_00,local_2c);
  QWidget::setBackgroundRole(in_stack_ffffffffffffff30,in_stack_ffffffffffffff2c);
  QWidget::setAutoFillBackground(in_RSI,SUB81((ulong)dd >> 0x38,0));
  QWidget::setMouseTracking(in_stack_ffffffffffffff30,SUB41(in_stack_ffffffffffffff2c >> 0x18,0));
  this_01 = (QMdiSubWindowPrivate *)operator_new(0x20);
  QVBoxLayout::QVBoxLayout((QVBoxLayout *)in_stack_ffffffffffffff30);
  QWidget::setLayout((QWidget *)this_00,
                     (QLayout *)CONCAT17(in_stack_ffffffffffffff67,in_stack_ffffffffffffff60));
  QWidget::setFocusPolicy(in_stack_ffffffffffffff30,in_stack_ffffffffffffff2c);
  QWidget::layout((QWidget *)0x632e48);
  QMargins::QMargins((QMargins *)in_stack_ffffffffffffff30);
  QLayout::setContentsMargins((QLayout *)in_RSI,(QMargins *)dd);
  QMdiSubWindowPrivate::updateGeometryConstraints(this_01);
  QWidget::setAttribute
            ((QWidget *)in_stack_ffffffffffffff98.d,in_stack_ffffffffffffff94,
             (bool)in_stack_ffffffffffffff93);
  QMdiSubWindowPrivate::desktopPalette(this_01);
  QPalette::operator=((QPalette *)in_stack_ffffffffffffff30,
                      (QPalette *)CONCAT44(in_stack_ffffffffffffff2c,in_stack_ffffffffffffff28));
  QPalette::~QPalette(&local_18);
  QApplication::font((char *)this_01);
  QFont::operator=((QFont *)in_stack_ffffffffffffff30,
                   (QFont *)CONCAT44(in_stack_ffffffffffffff2c,in_stack_ffffffffffffff28));
  QFont::~QFont(local_28);
  QWidget::windowIcon((QWidget *)this_01);
  bVar1 = QIcon::isNull();
  QIcon::~QIcon((QIcon *)&stack0xffffffffffffff98);
  if ((bVar1 & 1) == 0) {
    QWidget::windowIcon((QWidget *)this_01);
    QIcon::operator=((QIcon *)in_RSI,(QIcon *)dd);
    QIcon::~QIcon(&local_78);
  }
  else {
    pQVar2 = QWidget::style((QWidget *)CONCAT44(in_stack_ffffffffffffff2c,in_stack_ffffffffffffff28)
                           );
    (**(code **)(*(long *)pQVar2 + 0x100))(local_70,pQVar2,0,0,in_RDI);
    QIcon::operator=((QIcon *)in_RSI,(QIcon *)dd);
    QIcon::~QIcon((QIcon *)local_70);
  }
  pQVar3 = QCoreApplication::instance();
  this_02 = local_80;
  QObject::connect(this_02,(char *)pQVar3,(QObject *)"2focusChanged(QWidget*,QWidget*)",in_RDI,
                   0xb1fd3a);
  QMetaObject::Connection::~Connection((Connection *)this_02);
  if (*(long *)(in_FS_OFFSET + 0x28) == local_8) {
    return;
  }
  __stack_chk_fail();
}

Assistant:

QMdiSubWindow::QMdiSubWindow(QWidget *parent, Qt::WindowFlags flags)
    : QWidget(*new QMdiSubWindowPrivate, parent, { })
{
    Q_D(QMdiSubWindow);
#if QT_CONFIG(menu)
    d->createSystemMenu();
    addActions(d->systemMenu->actions());
#endif
    d->setWindowFlags(flags);
    setBackgroundRole(QPalette::Window);
    setAutoFillBackground(true);
    setMouseTracking(true);
    setLayout(new QVBoxLayout);
    setFocusPolicy(Qt::StrongFocus);
    layout()->setContentsMargins(QMargins());
    d->updateGeometryConstraints();
    setAttribute(Qt::WA_Resized, false);
    d->titleBarPalette = d->desktopPalette();
    d->font = QApplication::font("QMdiSubWindowTitleBar");
    // We don't want the menu icon by default on mac.
#ifndef Q_OS_MAC
    if (windowIcon().isNull())
        d->menuIcon = style()->standardIcon(QStyle::SP_TitleBarMenuButton, nullptr, this);
    else
        d->menuIcon = windowIcon();
#endif
    connect(qApp, SIGNAL(focusChanged(QWidget*,QWidget*)),
            this, SLOT(_q_processFocusChanged(QWidget*,QWidget*)));
}